

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O0

bool Js::DateImplementation::TryParseDecimalDigits
               (char16 *str,size_t length,size_t startIndex,size_t numDigits,int *value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int local_44;
  unsigned_short d;
  ulong uStack_40;
  int v;
  size_t i;
  int *value_local;
  size_t numDigits_local;
  size_t startIndex_local;
  size_t length_local;
  char16 *str_local;
  
  if (str == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x297,"(str)","str");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (length == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x298,"(length)","length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (length < startIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x299,"(startIndex <= length)","startIndex <= length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((numDigits == 0) || (9 < numDigits)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x29a,"(numDigits != 0 && numDigits <= 9)",
                                "numDigits != 0 && numDigits <= 9");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (length - startIndex < numDigits) {
    str_local._7_1_ = false;
  }
  else {
    uStack_40 = 0;
    do {
      bVar2 = false;
      if (str[startIndex + uStack_40] == L'0') {
        uStack_40 = uStack_40 + 1;
        bVar2 = uStack_40 < numDigits;
      }
    } while (bVar2);
    local_44 = 0;
    while ((uStack_40 < numDigits && ((ushort)(str[startIndex + uStack_40] + L'￐') < 10))) {
      local_44 = local_44 * 10 + (uint)(ushort)(str[startIndex + uStack_40] + L'￐');
      uStack_40 = uStack_40 + 1;
    }
    if (uStack_40 < numDigits) {
      str_local._7_1_ = false;
    }
    else {
      if (uStack_40 != numDigits) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                    ,0x2af,"(i == numDigits)","i == numDigits");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      *value = local_44;
      bVar2 = false;
      if (uStack_40 < length - startIndex) {
        bVar2 = (ushort)(str[startIndex + uStack_40] + L'￐') < 10;
      }
      str_local._7_1_ = (bool)(bVar2 ^ 1);
    }
  }
  return str_local._7_1_;
}

Assistant:

bool DateImplementation::TryParseDecimalDigits(
        const char16 *const str,
        const size_t length,
        const size_t startIndex,
        const size_t numDigits,
        int &value)
    {
        Assert(str);
        Assert(length);
        Assert(startIndex <= length);
        Assert(numDigits != 0 && numDigits <= 9); // will fit in an 'int'

        if(numDigits > length - startIndex)
            return false;

        size_t i = 0;

        // Skip leading zeroes
        while(str[startIndex + i] == _u('0') && ++i < numDigits);

        // Parse remaining digits
        int v = 0;
        for(; i < numDigits; ++i)
        {
            const unsigned short d = str[startIndex + i] - _u('0');
            if(d > 9)
                break;
            v = v * 10 + d;
        }
        if(i < numDigits)
            return false;
        Assert(i == numDigits);
        value = v;

        // The next character must not be a digit
        return !(i < length - startIndex && static_cast<unsigned short>(str[startIndex + i] - _u('0')) <= 9);
    }